

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitStringWTF16Get
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,StringWTF16Get *curr)

{
  long lVar1;
  int32_t *piVar2;
  Flow *pFVar3;
  char *pcVar4;
  ulong uVar5;
  anon_union_16_6_1532cd5a_for_Literal_0 local_100;
  undefined8 local_f0;
  undefined1 local_e8 [8];
  Literal refValue;
  Flow ref;
  Flow pos;
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)&refValue.type,this,*(Expression **)(curr + 0x10));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x18));
    if (pos.breakTo.super_IString.str._M_len == 0) {
      if (((long)((long)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
          -0x5555555555555555 + refValue.type.id != 1) {
LAB_0014054c:
        __assert_fail("values.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x52,"const Literal &wasm::Flow::getSingleValue()");
      }
      wasm::Literal::Literal((Literal *)local_e8,(Literal *)&ref);
      wasm::Literal::getGCData();
      pcVar4 = pos.breakTo.super_IString.str._M_str;
      if (pos.breakTo.super_IString.str._M_str == (char *)0x0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        pcVar4 = pos.breakTo.super_IString.str._M_str;
      }
      if (ref.breakTo.super_IString.str._M_str +
          ((long)((long)pos.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 pos.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
          -0x5555555555555555 != (char *)0x1) goto LAB_0014054c;
      if (pos.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
          super_IString.str._M_str != (char *)0x2) {
LAB_0014056b:
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
      uVar5 = (ulong)(uint)pos.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      lVar1 = *(long *)(pcVar4 + 0x28);
      if ((ulong)((*(long *)(pcVar4 + 0x30) - lVar1 >> 3) * -0x5555555555555555 +
                 *(long *)(pcVar4 + 8)) <= uVar5) {
        (*this->_vptr_ExpressionRunner[2])(this,"string oob");
        lVar1 = *(long *)(pcVar4 + 0x28);
      }
      piVar2 = (int32_t *)(lVar1 + -0x18 + uVar5 * 0x18);
      if (uVar5 == 0) {
        piVar2 = (int32_t *)(pcVar4 + 0x10);
      }
      if (*(long *)(piVar2 + 4) != 2) goto LAB_0014056b;
      local_100.i32 = *piVar2;
      local_f0 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)&local_100.func);
      wasm::Literal::~Literal((Literal *)&local_100.func);
      if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      wasm::Literal::~Literal((Literal *)local_e8);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)ref.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&pos);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)pos.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           pos.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           pos.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pos.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      pos.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pos.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)pos.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)pos.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &pos.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&pos);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         refValue.type.id;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ref);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ref.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  pFVar3 = (Flow *)wasm::Literal::~Literal((Literal *)&ref);
  return pFVar3;
}

Assistant:

Flow visitStringWTF16Get(StringWTF16Get* curr) {
    NOTE_ENTER("StringWTF16Get");
    Flow ref = visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow pos = visit(curr->pos);
    if (pos.breaking()) {
      return pos;
    }
    auto refValue = ref.getSingleValue();
    auto data = refValue.getGCData();
    if (!data) {
      trap("null ref");
    }
    auto& values = data->values;
    Index i = pos.getSingleValue().geti32();
    if (i >= values.size()) {
      trap("string oob");
    }

    return Literal(values[i].geti32());
  }